

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clustergraph.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
libDAI::ClusterGraph::ind_delta
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          ClusterGraph *this,size_t i)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __position;
  size_t local_18;
  
  local_18 = i;
  ind_Delta(__return_storage_ptr__,this,
            (this->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V1.
            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start + i);
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                         ((__return_storage_ptr__->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start,
                          (__return_storage_ptr__->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish,&local_18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
            (__return_storage_ptr__,(const_iterator)__position._M_current);
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> ind_delta( size_t i ) const {
                std::vector<size_t> result = ind_Delta( V1(i) );
                std::vector<size_t>::iterator it = find( result.begin(), result.end(), i );
                result.erase( it );
                return result;
            }